

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O1

bool __thiscall TGAImage::load_rle_data(TGAImage *this,ifstream *in)

{
  ifstream *piVar1;
  ifstream *piVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  TGAColor colorbuffer;
  uchar local_70 [8];
  ulong local_68;
  ulong local_60;
  ifstream *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar5 = (ulong)(this->height * this->width);
  local_70[4] = 0;
  local_70[0] = '\0';
  local_70[1] = '\0';
  local_70[2] = '\0';
  local_70[3] = '\0';
  local_50 = uVar5 + 1;
  uVar11 = 0;
  lVar9 = 0;
  local_60 = uVar5;
  local_58 = in;
  do {
    piVar1 = local_58;
    cVar3 = std::istream::get();
    piVar2 = local_58;
    if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
      if (cVar3 < '\0') {
        std::istream::read((char *)local_58,(long)local_70);
        if (*(int *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18) + 0x20) != 0) {
          lVar7 = 0x2b;
          pcVar8 = "an error occurred while reading the header\n";
          goto LAB_00103e98;
        }
        uVar4 = (uint)(byte)(cVar3 + 0x81);
        bVar12 = uVar4 != 0;
        if (bVar12) {
          uVar6 = 0;
          do {
            if (this->bytespp != 0) {
              uVar10 = 0;
              do {
                (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar10 + lVar9] = local_70[uVar10];
                uVar10 = uVar10 + 1;
              } while (uVar10 < this->bytespp);
              lVar9 = lVar9 + uVar10;
            }
            uVar11 = uVar11 + 1;
            if (uVar5 < uVar11) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Too many pixels read\n",0x15);
              break;
            }
            uVar6 = uVar6 + 1;
            bVar12 = uVar6 < uVar4;
          } while (uVar6 != uVar4);
        }
        if (!bVar12) goto LAB_00104083;
        goto LAB_00103e9d;
      }
      uVar6 = (ulong)(uint)(byte)(cVar3 + 1);
      bVar12 = (byte)(cVar3 + 1) != 0;
      if (bVar12) {
        local_40 = uVar11 + 1;
        if (uVar11 + 1 <= local_50) {
          local_40 = local_50;
        }
        local_48 = uVar11 + uVar6;
        local_38 = ~uVar11 + local_40;
        uVar10 = 0;
        local_68 = uVar11;
        do {
          piVar1 = local_58;
          std::istream::read((char *)local_58,(long)local_70);
          if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"an error occurred while reading the header\n",0x2b);
            uVar5 = local_60;
            uVar11 = local_68;
            break;
          }
          if (this->bytespp != 0) {
            uVar5 = 0;
            do {
              (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_start[uVar5 + lVar9] = local_70[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar5 < this->bytespp);
            lVar9 = lVar9 + uVar5;
          }
          if (uVar10 == local_38) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Too many pixels read\n",0x15);
            uVar5 = local_60;
            uVar11 = local_40;
            break;
          }
          local_68 = local_68 + 1;
          uVar10 = uVar10 + 1;
          bVar12 = uVar10 < uVar6;
          uVar5 = local_60;
          uVar11 = local_48;
        } while (uVar10 != uVar6);
      }
      local_68 = uVar11;
      uVar11 = local_68;
      if (bVar12) {
        bVar12 = false;
      }
      else {
LAB_00104083:
        bVar12 = true;
      }
    }
    else {
      lVar7 = 0x29;
      pcVar8 = "an error occurred while reading the data\n";
LAB_00103e98:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,lVar7);
LAB_00103e9d:
      bVar12 = false;
    }
    if ((bVar12 == false) || (uVar5 <= uVar11)) {
      return bVar12;
    }
  } while( true );
}

Assistant:

bool TGAImage::load_rle_data(std::ifstream &in)
{
    size_t pixelcount = width * height;
    size_t currentpixel = 0;
    size_t currentbyte = 0;
    TGAColor colorbuffer;
    do {
        std::uint8_t chunkheader = 0;
        chunkheader = in.get();
        if (!in.good()) {
            std::cerr << "an error occurred while reading the data\n";
            return false;
        }
        if (chunkheader < 128) {
            chunkheader++;
            for (size_t i = 0; i < chunkheader; i++) {
                in.read(reinterpret_cast<char *>(colorbuffer.bgra), bytespp);
                if (!in.good()) {
                    std::cerr << "an error occurred while reading the header\n";
                    return false;
                }
                for (size_t t = 0; t < bytespp; t++) data[currentbyte++] = colorbuffer.bgra[t];
                currentpixel++;
                if (currentpixel > pixelcount) {
                    std::cerr << "Too many pixels read\n";
                    return false;
                }
            }
        } else {
            chunkheader -= 127;
            in.read(reinterpret_cast<char *>(colorbuffer.bgra), bytespp);
            if (!in.good()) {
                std::cerr << "an error occurred while reading the header\n";
                return false;
            }
            for (size_t i = 0; i < chunkheader; i++) {
                for (size_t t = 0; t < bytespp; t++) data[currentbyte++] = colorbuffer.bgra[t];
                currentpixel++;
                if (currentpixel > pixelcount) {
                    std::cerr << "Too many pixels read\n";
                    return false;
                }
            }
        }
    } while (currentpixel < pixelcount);
    return true;
}